

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcBSplineCurve::~IfcBSplineCurve(IfcBSplineCurve *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  p_Var2 = (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[0xfffffffffffffffd];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem
                   .super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined8 *)
   ((long)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper + (long)p_Var2) = 0x8e9780;
  *(undefined8 *)(&this->field_0xb0 + (long)p_Var2) = 0x8e9848;
  *(undefined8 *)
   (&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
     super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
   (long)p_Var2) = 0x8e97a8;
  *(undefined8 *)
   (&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
     super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
   (long)p_Var2) = 0x8e97d0;
  *(undefined8 *)
   (&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 +
   (long)p_Var2) = 0x8e97f8;
  *(undefined8 *)(&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 + (long)p_Var2) =
       0x8e9820;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)&(this->SelfIntersect).
                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + (long)p_Var2);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x98) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x98));
  }
  if (*(code **)(p_Var1 + 0x70) != p_Var1 + 0x80) {
    operator_delete(*(code **)(p_Var1 + 0x70));
  }
  if (*(void **)(p_Var1 + 0x58) != (void *)0x0) {
    operator_delete(*(void **)(p_Var1 + 0x58));
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcBSplineCurve() : Object("IfcBSplineCurve") {}